

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCompositeInertia.cpp
# Opt level: O1

void __thiscall
chrono::utils::CompositeInertia::AddComponent
          (CompositeInertia *this,ChFrame<double> *frame,double mass,ChMatrix33<double> *inertia,
          bool is_void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined7 in_register_00000009;
  ActualDstType actualDst;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChMatrix33<double> increment;
  ChMatrix33<double> shift;
  assign_op<double,_double> local_e9;
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_a0;
  Matrix<double,_3,_3,_1,_3,_3> local_60;
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = mass;
  local_a0.m_lhs.m_lhs.m_lhs = &(frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>;
  dVar6 = (double)((ulong)is_void * -0x4010000000000000 + (ulong)!is_void * 0x3ff0000000000000);
  dVar1 = this->m_mass;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar6;
  auVar12 = vfmadd213sd_fma(auVar10._0_16_,auVar13,auVar14);
  dVar11 = 1.0 / auVar12._0_8_;
  dVar2 = (this->m_com).m_data[2];
  dVar6 = dVar6 * mass;
  dVar3 = (frame->coord).pos.m_data[2];
  dVar4 = (this->m_com).m_data[1];
  dVar5 = (frame->coord).pos.m_data[1];
  (this->m_com).m_data[0] =
       dVar11 * (dVar1 * (this->m_com).m_data[0] + dVar6 * (frame->coord).pos.m_data[0]);
  (this->m_com).m_data[1] = dVar11 * (dVar1 * dVar4 + dVar6 * dVar5);
  (this->m_com).m_data[2] = dVar11 * (dVar1 * dVar2 + dVar6 * dVar3);
  this->m_mass = auVar12._0_8_;
  dVar1 = (frame->coord).pos.m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (frame->coord).pos.m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5] * local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
             array[5];
  auVar12 = vfmadd213sd_fma(auVar12,auVar12,auVar15);
  local_a0.m_rhs.m_lhs = &local_60;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar12._0_8_;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (frame->coord).pos.m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar12 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar12._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 * dVar1;
  auVar12 = vfmadd231sd_fma(auVar16,auVar17,auVar17);
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar12._0_8_;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       -local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
        [2];
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar1 * local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[2];
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5] * local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
             array[2];
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5] * -dVar1;
  local_a0.m_lhs.m_lhs.m_rhs = &inertia->super_Matrix<double,_3,_3,_1,_3,_3>;
  local_a0.m_lhs.m_rhs.m_matrix = local_a0.m_lhs.m_lhs.m_lhs;
  local_a0.m_rhs.m_rhs.m_functor.m_other = mass;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)local_e8,&local_a0,&local_e9);
  auVar12 = *(undefined1 (*) [16])
             (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array;
  if ((int)CONCAT71(in_register_00000009,is_void) == 0) {
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_e8._0_8_ + auVar12._0_8_;
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_e8._8_8_ + auVar12._8_8_;
    dVar1 = (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_d8 +
         (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         dStack_d0 + dVar1;
    dVar1 = (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_c8 +
         (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         dStack_c0 + dVar1;
    dVar1 = (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_b8 +
         (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         dStack_b0 + dVar1;
    local_a8 = local_a8 +
               (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
  }
  else {
    auVar12 = vsubpd_avx(auVar12,local_e8);
    *(undefined1 (*) [16])
     (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar12;
    auVar12 = *(undefined1 (*) [16])
               ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               + 4);
    auVar13 = *(undefined1 (*) [16])
               ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               + 6);
    auVar7._8_8_ = dStack_d0;
    auVar7._0_8_ = local_d8;
    auVar14 = vsubpd_avx(*(undefined1 (*) [16])
                          ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 2),auVar7);
    *(undefined1 (*) [16])
     ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
         auVar14;
    auVar8._8_8_ = dStack_c0;
    auVar8._0_8_ = local_c8;
    auVar12 = vsubpd_avx(auVar12,auVar8);
    *(undefined1 (*) [16])
     ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
         auVar12;
    auVar9._8_8_ = dStack_b0;
    auVar9._0_8_ = local_b8;
    auVar12 = vsubpd_avx(auVar13,auVar9);
    *(undefined1 (*) [16])
     ((this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
         auVar12;
    local_a8 = (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] - local_a8;
  }
  (this->m_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_a8;
  return;
}

Assistant:

void CompositeInertia::AddComponent(
    const ChFrame<>& frame,       // centroidal frame of sub-component
    double mass,                  // mass of sub-component
    const ChMatrix33<>& inertia,  // sub-component inertia tensor w.r.t. its centroidal frame
    bool is_void                  // indicate if sub-component represents a material void
    ) {
    const ChVector<>& com = frame.GetPos();
    const ChMatrix33<>& A = frame.GetA();

    double sign = is_void ? -1 : +1;

    // Update location of composite COM
    m_com = (m_mass * m_com + sign * mass * com) / (m_mass + sign * mass);

    // Update composite mass
    m_mass = m_mass + sign * mass;

    // Express sub-component inertia w.r.t. the reference frame and update composite inertia
    ChMatrix33<> increment = A * inertia * A.transpose() + InertiaShiftMatrix(com) * mass;
    if (is_void)
        m_inertia -= increment;
    else
        m_inertia += increment;
}